

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O2

void __thiscall
soplex::SPxSolverBase<double>::perturbMax
          (SPxSolverBase<double> *this,UpdateVector<double> *uvec,VectorBase<double> *p_low,
          VectorBase<double> *p_up,double eps,double p_delta,int start,int incr)

{
  Random *this_00;
  double dVar1;
  double dVar2;
  int iVar3;
  pointer pdVar4;
  pointer pdVar5;
  Status SVar6;
  double *pdVar7;
  uint uVar8;
  Real RVar9;
  double dVar10;
  double minimum;
  double maximum;
  
  pdVar4 = (uvec->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  minimum = p_delta * 10.0;
  maximum = p_delta * 100.0;
  this_00 = &this->random;
  if (this->fullPerturbation == true) {
    for (uVar8 = ~start + (int)((ulong)((long)(uvec->super_VectorBase<double>).val.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                       (long)pdVar4) >> 3); -1 < (int)uVar8; uVar8 = uVar8 - incr) {
      dVar10 = (p_up->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8];
      dVar1 = (p_low->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8];
      dVar2 = pdVar4[uVar8];
      pdVar7 = (double *)infinity();
      if (((dVar10 - *pdVar7 < -p_delta) && (p_delta < ABS(dVar1 - dVar10))) &&
         (dVar10 <= dVar2 + p_delta)) {
        RVar9 = Random::next(this_00,minimum,maximum);
        (p_up->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8] = RVar9 + dVar2;
        this->theShift = ((RVar9 + dVar2) - dVar10) + this->theShift;
      }
      pdVar7 = (double *)infinity();
      if (((p_delta < *pdVar7 + dVar1) && (p_delta < ABS(dVar1 - dVar10))) &&
         (dVar2 - p_delta <= dVar1)) {
        RVar9 = Random::next(this_00,minimum,maximum);
        (p_low->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8] = dVar2 - RVar9;
        this->theShift = this->theShift - ((dVar2 - RVar9) - dVar1);
      }
    }
  }
  else {
    pdVar5 = (uvec->thedelta).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    for (uVar8 = ~start + (uvec->thedelta).super_IdxSet.num; -1 < (int)uVar8; uVar8 = uVar8 - incr)
    {
      iVar3 = (uvec->thedelta).super_IdxSet.idx[uVar8];
      dVar10 = pdVar5[iVar3];
      dVar1 = (p_up->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar3];
      dVar2 = (p_low->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar3];
      SVar6 = SPxBasisBase<double>::dualStatus
                        (&this->super_SPxBasisBase<double>,
                         (this->super_SPxBasisBase<double>).theBaseId.data + iVar3);
      if (SVar6 != D_ON_BOTH) {
        if (dVar10 <= eps) {
          if (dVar10 < -eps) {
            pdVar7 = (double *)infinity();
            if (((eps < *pdVar7 + dVar2) && (eps < ABS(dVar2 - dVar1))) &&
               (dVar10 = pdVar4[iVar3], dVar10 <= dVar2 + eps)) {
              RVar9 = Random::next(this_00,minimum,maximum);
              dVar10 = dVar10 - RVar9;
              (p_low->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar3] = dVar10;
              dVar10 = this->theShift - (dVar10 - dVar2);
              goto LAB_001d4512;
            }
          }
        }
        else {
          pdVar7 = (double *)infinity();
          if (((dVar1 - *pdVar7 < -eps) && (eps < ABS(dVar2 - dVar1))) &&
             (dVar10 = pdVar4[iVar3], dVar1 - eps <= dVar10)) {
            RVar9 = Random::next(this_00,minimum,maximum);
            dVar10 = dVar10 + RVar9;
            (p_up->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar3] = dVar10;
            dVar10 = (dVar10 - dVar1) + this->theShift;
LAB_001d4512:
            this->theShift = dVar10;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::perturbMax(
   const UpdateVector<R>& uvec,
   VectorBase<R>& p_low,
   VectorBase<R>& p_up,
   R eps,
   R p_delta,
   int start,
   int incr)
{
   assert(uvec.dim() == p_low.dim());
   assert(uvec.dim() == p_up.dim());

   const R* vec = uvec.get_const_ptr();
   R minrandom = 10.0 * p_delta;
   R maxrandom = 100.0 * p_delta;
   R x, l, u;
   int i;

   if(fullPerturbation)
   {
      eps = p_delta;

      for(i = uvec.dim() - start - 1; i >= 0; i -= incr)
      {
         u = p_up[i];
         l = p_low[i];
         x = vec[i];

         if(LT(u, R(infinity), eps) && NE(l, u, eps) && u <= x + eps)
         {
            p_up[i] = x + random.next((double)minrandom, (double)maxrandom);
            theShift += p_up[i] - u;
         }

         if(GT(l, R(-infinity), eps) && NE(l, u, eps) && l >= x - eps)
         {
            p_low[i] = x - random.next((double)minrandom, (double)maxrandom);
            theShift -= p_low[i] - l;
         }
      }
   }
   else
   {
      const R* upd = uvec.delta().values();
      const IdxSet& idx = uvec.delta().indices();

      for(int j = uvec.delta().size() - start - 1; j >= 0; j -= incr)
      {
         i = idx.index(j);
         x = upd[i];
         u = p_up[i];
         l = p_low[i];

         // do not permute these bounds! c.f. computeFrhs2() in spxvecs.cpp
         if(this->dualStatus(this->baseId(i)) == SPxBasisBase<R>::Desc::D_ON_BOTH)
         {
            continue;
         }

         if(x > eps)
         {
            if(LT(u, R(infinity), eps) && NE(l, u, eps) && vec[i] >= u - eps)
            {
               p_up[i] = vec[i] + random.next((double)minrandom, (double)maxrandom);
               theShift += p_up[i] - u;
            }
         }
         else if(x < -eps)
         {
            if(GT(l, R(-infinity), eps) && NE(l, u, eps) && vec[i] <= l + eps)
            {
               p_low[i] = vec[i] - random.next((double)minrandom, (double)maxrandom);
               theShift -= p_low[i] - l;
            }
         }
      }
   }
}